

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

INT W32toUnixAccessControl(DWORD flProtect)

{
  uint uVar1;
  undefined4 local_10;
  INT MemAccessControl;
  DWORD flProtect_local;
  
  uVar1 = flProtect & 0xff;
  if (uVar1 == 1) {
    local_10 = 0;
  }
  else if (uVar1 == 2) {
    local_10 = 1;
  }
  else if (uVar1 == 4) {
    local_10 = 3;
  }
  else if (uVar1 == 0x10) {
    local_10 = 5;
  }
  else if (uVar1 == 0x20) {
    local_10 = 5;
  }
  else if (uVar1 == 0x40) {
    local_10 = 7;
  }
  else {
    local_10 = 0;
    if (!PAL_InitializeChakraCoreCalled) {
      abort();
    }
  }
  return local_10;
}

Assistant:

INT W32toUnixAccessControl( IN DWORD flProtect )
{
    INT MemAccessControl = 0;

    switch ( flProtect & 0xff )
    {
    case PAGE_READONLY :
        MemAccessControl = PROT_READ;
        break;
    case PAGE_READWRITE :
        MemAccessControl = PROT_READ | PROT_WRITE;
        break;
    case PAGE_EXECUTE_READWRITE:
        MemAccessControl = PROT_EXEC | PROT_READ | PROT_WRITE;
        break;
    case PAGE_EXECUTE :
        MemAccessControl = PROT_EXEC | PROT_READ; // WinAPI PAGE_EXECUTE also implies readable
        break;
    case PAGE_EXECUTE_READ :
        MemAccessControl = PROT_EXEC | PROT_READ;
        break;
    case PAGE_NOACCESS :
        MemAccessControl = PROT_NONE;
        break;
    
    default:
        MemAccessControl = 0;
        ERROR( "Incorrect or no protection flags specified.\n" );
        break;
    }
    return MemAccessControl;
}